

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl
          (LineTable *this,SectionedAddress Address,uint64_t Size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Result)

{
  uint uVar1;
  Sequence *pSVar2;
  uint uVar3;
  uint32_t uVar4;
  const_iterator Seq;
  uint64_t uVar5;
  ulong uVar6;
  const_iterator Seq_00;
  uint uVar7;
  SectionedAddress Address_00;
  undefined1 local_98 [8];
  Sequence Sequence;
  uint local_34;
  
  uVar5 = Address.SectionIndex;
  uVar6 = Address.Address;
  if ((this->Sequences).
      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Sequences).
      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    DWARFDebugLine::Sequence::Sequence((Sequence *)local_98);
    pSVar2 = (this->Sequences).
             super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Sequence.LowPC = uVar6;
    Sequence.HighPC = uVar5;
    Seq = upper_bound<std::vector<llvm::DWARFDebugLine::Sequence,std::allocator<llvm::DWARFDebugLine::Sequence>>const&,llvm::DWARFDebugLine::Sequence&,bool(*)(llvm::DWARFDebugLine::Sequence_const&,llvm::DWARFDebugLine::Sequence_const&)>
                    (&this->Sequences,(Sequence *)local_98,DWARFDebugLine::Sequence::orderByHighPC);
    if (Seq._M_current != pSVar2) {
      if ((Seq._M_current)->SectionIndex != uVar5) {
        return false;
      }
      if (uVar6 < (Seq._M_current)->LowPC) {
        return false;
      }
      if (uVar6 < (Seq._M_current)->HighPC) {
        Sequence._32_8_ = (Size + uVar6) - 1;
        Seq_00 = Seq;
        while( true ) {
          if (Seq_00._M_current == pSVar2) {
            return true;
          }
          if (Size + uVar6 <= (Seq_00._M_current)->LowPC) break;
          if (Seq_00._M_current == Seq._M_current) {
            uVar7 = findRowInSeq(this,Seq._M_current,Address);
          }
          else {
            uVar7 = (Seq_00._M_current)->FirstRowIndex;
          }
          Address_00.SectionIndex = uVar5;
          Address_00.Address = Sequence._32_8_;
          uVar4 = findRowInSeq(this,Seq_00._M_current,Address_00);
          uVar1 = this->UnknownRowIndex;
          uVar3 = (Seq_00._M_current)->LastRowIndex - 1;
          if (uVar4 != uVar1) {
            uVar3 = uVar4;
          }
          if (uVar7 == uVar1) {
            __assert_fail("FirstRowIndex != UnknownRowIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                          ,0x3f4,
                          "bool llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl(object::SectionedAddress, uint64_t, std::vector<uint32_t> &) const"
                         );
          }
          if (uVar3 == uVar1) {
            __assert_fail("LastRowIndex != UnknownRowIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                          ,0x3f5,
                          "bool llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl(object::SectionedAddress, uint64_t, std::vector<uint32_t> &) const"
                         );
          }
          while (local_34 = uVar7, uVar7 <= uVar3) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(Result,&local_34);
            uVar7 = local_34 + 1;
          }
          Seq_00._M_current = Seq_00._M_current + 1;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DWARFDebugLine::LineTable::lookupAddressRangeImpl(
    object::SectionedAddress Address, uint64_t Size,
    std::vector<uint32_t> &Result) const {
  if (Sequences.empty())
    return false;
  uint64_t EndAddr = Address.Address + Size;
  // First, find an instruction sequence containing the given address.
  DWARFDebugLine::Sequence Sequence;
  Sequence.SectionIndex = Address.SectionIndex;
  Sequence.HighPC = Address.Address;
  SequenceIter LastSeq = Sequences.end();
  SequenceIter SeqPos = llvm::upper_bound(
      Sequences, Sequence, DWARFDebugLine::Sequence::orderByHighPC);
  if (SeqPos == LastSeq || !SeqPos->containsPC(Address))
    return false;

  SequenceIter StartPos = SeqPos;

  // Add the rows from the first sequence to the vector, starting with the
  // index we just calculated

  while (SeqPos != LastSeq && SeqPos->LowPC < EndAddr) {
    const DWARFDebugLine::Sequence &CurSeq = *SeqPos;
    // For the first sequence, we need to find which row in the sequence is the
    // first in our range.
    uint32_t FirstRowIndex = CurSeq.FirstRowIndex;
    if (SeqPos == StartPos)
      FirstRowIndex = findRowInSeq(CurSeq, Address);

    // Figure out the last row in the range.
    uint32_t LastRowIndex =
        findRowInSeq(CurSeq, {EndAddr - 1, Address.SectionIndex});
    if (LastRowIndex == UnknownRowIndex)
      LastRowIndex = CurSeq.LastRowIndex - 1;

    assert(FirstRowIndex != UnknownRowIndex);
    assert(LastRowIndex != UnknownRowIndex);

    for (uint32_t I = FirstRowIndex; I <= LastRowIndex; ++I) {
      Result.push_back(I);
    }

    ++SeqPos;
  }

  return true;
}